

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

string * __thiscall QPDF::getFilename_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  long *plVar1;
  
  plVar1 = (long *)(**(code **)(**(long **)&(((this->m)._M_t.
                                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                              .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                             _M_head_impl)->file).
                                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                               + 0x18))();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getFilename() const
{
    return m->file->getName();
}